

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

int hts_detect_format(hFILE *hfile,htsFormat *fmt)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  ssize_t sVar4;
  undefined8 uVar5;
  htsCompression hVar6;
  uchar *u;
  undefined1 auVar7 [16];
  uchar s [21];
  uchar *local_298;
  undefined4 local_290;
  undefined1 *local_280;
  undefined4 local_278;
  ulong local_270;
  undefined1 local_258 [16];
  uchar buffer [512];
  
  uVar3 = hpeek(hfile,s,0x12);
  if ((long)uVar3 < 0) {
    return -1;
  }
  if (((uVar3 < 2) || (s[0] != '\x1f')) || (s[1] != 0x8b)) {
    fmt->compression = no_compression;
    uVar3 = hpeek(hfile,s,0x15);
  }
  else {
    hVar6 = gzip;
    if ((0x11 < uVar3) && ((s._0_4_ & 0x4000000) != 0)) {
      hVar6 = (s._12_4_ == 0x24342) + gzip;
    }
    fmt->compression = hVar6;
    sVar4 = hpeek(hfile,buffer,0x200);
    if (-1 < sVar4) {
      local_258 = (undefined1  [16])0x0;
      local_290 = (undefined4)sVar4;
      local_278 = 0x15;
      local_298 = buffer;
      local_280 = s;
      iVar2 = inflateInit2_(&local_298,0x1f,"1.2.11",0x70);
      if (iVar2 == 0) {
        uVar3 = local_270;
        if (local_270 < 0x15) {
          do {
            iVar2 = inflate(&local_298,2);
            uVar3 = local_270;
            if (iVar2 != 0) break;
          } while (local_270 < 0x15);
        }
        inflateEnd(&local_298);
        goto LAB_0010b508;
      }
    }
    uVar3 = 0;
  }
LAB_0010b508:
  if ((long)uVar3 < 0) {
    return -1;
  }
  fmt->compression_level = -1;
  fmt->specific = (void *)0x0;
  if ((5 < uVar3) && ((s[5] < 2 && s._0_4_ == 0x4d415243) && (byte)(s[4] - 1) < 3)) {
    fmt->category = sequence_data;
    fmt->format = cram;
    (fmt->version).major = (ushort)s[4];
    (fmt->version).minor = (ushort)s[5];
    fmt->compression = custom;
    return 0;
  }
  if ((3 < uVar3) && (s[3] < 5)) {
    if (s._0_4_ == 0x1494142) {
      uVar5 = 0x500000003;
    }
    else {
      if (s._0_4_ != 0x1494254) {
        if (s._0_4_ == 0x1495343) {
          uVar5 = 0xa00000003;
        }
        else if (s._0_4_ == 0x4464342) {
          uVar5 = 0x900000002;
        }
        else {
          if (s._0_4_ == 0x2464342) {
            fmt->category = variant_data;
            fmt->format = bcf;
            (fmt->version).major = (ushort)s[3];
            uVar1 = (ushort)s[4];
            if (2 < s[4]) {
              uVar1 = 0;
            }
            if (uVar3 < 5) {
              uVar1 = 0;
            }
            (fmt->version).minor = uVar1;
            return 0;
          }
          if (s._0_4_ != 0x14d4142) {
            fmt->category = unknown_category;
            fmt->format = unknown_format;
            (fmt->version).major = -1;
            (fmt->version).minor = -1;
            fmt->compression = no_compression;
            return 0;
          }
          uVar5 = 0x400000001;
        }
        goto LAB_0010b736;
      }
      uVar5 = 0xc00000003;
    }
    fmt->category = (int)uVar5;
    fmt->format = (int)((ulong)uVar5 >> 0x20);
LAB_0010b769:
    (fmt->version).major = -1;
    (fmt->version).minor = -1;
    return 0;
  }
  if (0xf < uVar3) {
    auVar7[0] = -(s[0] == '#');
    auVar7[1] = -(s[1] == '#');
    auVar7[2] = -(s[2] == 'f');
    auVar7[3] = -(s[3] == 'i');
    auVar7[4] = -(s[4] == 'l');
    auVar7[5] = -(s[5] == 'e');
    auVar7[6] = -(s[6] == 'f');
    auVar7[7] = -(s[7] == 'o');
    auVar7[8] = -(s[8] == 'r');
    auVar7[9] = -(s[9] == 'm');
    auVar7[10] = -(s[10] == 'a');
    auVar7[0xb] = -(s[0xb] == 't');
    auVar7[0xc] = -(s[0xc] == '=');
    auVar7[0xd] = -(s[0xd] == 'V');
    auVar7[0xe] = -(s[0xe] == 'C');
    auVar7[0xf] = -(s[0xf] == 'F');
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf)
        == 0xffff) {
      fmt->category = variant_data;
      fmt->format = vcf;
      if ((0x14 < uVar3) && (s[0x10] == 'v')) {
        u = s + 0x11;
        goto LAB_0010b6e3;
      }
      goto LAB_0010b769;
    }
  }
  if (((3 < uVar3) && (s[0] == '@')) &&
     ((s._0_4_ == 0x9444840 ||
      (((s._0_4_ == 0x9475040 || (s._0_4_ == 0x9515340)) || (s._0_4_ == 0x9475240)))))) {
    fmt->category = sequence_data;
    fmt->format = sam;
    if ((8 < uVar3) && (iVar2 = bcmp(s,"@HD\tVN:",7), iVar2 == 0)) {
      u = s + 7;
LAB_0010b6e3:
      parse_version(fmt,u,s + uVar3);
      return 0;
    }
    goto LAB_0010b739;
  }
  uVar5 = 0x300000001;
LAB_0010b736:
  fmt->category = (int)uVar5;
  fmt->format = (int)((ulong)uVar5 >> 0x20);
LAB_0010b739:
  (fmt->version).major = 1;
  (fmt->version).minor = -1;
  return 0;
}

Assistant:

int hts_detect_format(hFILE *hfile, htsFormat *fmt)
{
    unsigned char s[21];
    ssize_t len = hpeek(hfile, s, 18);
    if (len < 0) return -1;

    if (len >= 2 && s[0] == 0x1f && s[1] == 0x8b) {
        // The stream is either gzip-compressed or BGZF-compressed.
        // Determine which, and decompress the first few bytes.
        fmt->compression = (len >= 18 && (s[3] & 4) &&
                            memcmp(&s[12], "BC\2\0", 4) == 0)? bgzf : gzip;
        len = decompress_peek(hfile, s, sizeof s);
    }
    else {
        fmt->compression = no_compression;
        len = hpeek(hfile, s, sizeof s);
    }
    if (len < 0) return -1;

    fmt->compression_level = -1;
    fmt->specific = NULL;

    if (len >= 6 && memcmp(s,"CRAM",4) == 0 && s[4]>=1 && s[4]<=3 && s[5]<=1) {
        fmt->category = sequence_data;
        fmt->format = cram;
        fmt->version.major = s[4], fmt->version.minor = s[5];
        fmt->compression = custom;
        return 0;
    }
    else if (len >= 4 && s[3] <= '\4') {
        if (memcmp(s, "BAM\1", 4) == 0) {
            fmt->category = sequence_data;
            fmt->format = bam;
            // TODO Decompress enough to pick version from @HD-VN header
            fmt->version.major = 1, fmt->version.minor = -1;
            return 0;
        }
        else if (memcmp(s, "BAI\1", 4) == 0) {
            fmt->category = index_file;
            fmt->format = bai;
            fmt->version.major = -1, fmt->version.minor = -1;
            return 0;
        }
        else if (memcmp(s, "BCF\4", 4) == 0) {
            fmt->category = variant_data;
            fmt->format = bcf;
            fmt->version.major = 1, fmt->version.minor = -1;
            return 0;
        }
        else if (memcmp(s, "BCF\2", 4) == 0) {
            fmt->category = variant_data;
            fmt->format = bcf;
            fmt->version.major = s[3];
            fmt->version.minor = (len >= 5 && s[4] <= 2)? s[4] : 0;
            return 0;
        }
        else if (memcmp(s, "CSI\1", 4) == 0) {
            fmt->category = index_file;
            fmt->format = csi;
            fmt->version.major = 1, fmt->version.minor = -1;
            return 0;
        }
        else if (memcmp(s, "TBI\1", 4) == 0) {
            fmt->category = index_file;
            fmt->format = tbi;
            fmt->version.major = -1, fmt->version.minor = -1;
            return 0;
        }
    }
    else if (len >= 16 && memcmp(s, "##fileformat=VCF", 16) == 0) {
        fmt->category = variant_data;
        fmt->format = vcf;
        if (len >= 21 && s[16] == 'v')
            parse_version(fmt, &s[17], &s[len]);
        else
            fmt->version.major = fmt->version.minor = -1;
        return 0;
    }
    else if (len >= 4 && s[0] == '@' &&
             (memcmp(s, "@HD\t", 4) == 0 || memcmp(s, "@SQ\t", 4) == 0 ||
              memcmp(s, "@RG\t", 4) == 0 || memcmp(s, "@PG\t", 4) == 0)) {
        fmt->category = sequence_data;
        fmt->format = sam;
        // @HD-VN is not guaranteed to be the first tag, but then @HD is
        // not guaranteed to be present at all...
        if (len >= 9 && memcmp(s, "@HD\tVN:", 7) == 0)
            parse_version(fmt, &s[7], &s[len]);
        else
            fmt->version.major = 1, fmt->version.minor = -1;
        return 0;
    }
    else {
        // Various possibilities for tab-delimited text:
        // .crai   (gzipped tab-delimited six columns: seqid 5*number)
        // .bed    ([3..12] tab-delimited columns)
        // .bedpe  (>= 10 tab-delimited columns)
        // .sam    (tab-delimited >= 11 columns: seqid number seqid...)
        // FIXME For now, assume it's SAM
        fmt->category = sequence_data;
        fmt->format = sam;
        fmt->version.major = 1, fmt->version.minor = -1;
        return 0;
    }

    fmt->category = unknown_category;
    fmt->format = unknown_format;
    fmt->version.major = fmt->version.minor = -1;
    fmt->compression = no_compression;
    return 0;
}